

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::RemoveAt(CopyRemovePolicy<JsUtil::List<long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
           *this,List<long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *list,int index)

{
  Type plVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Type plVar6;
  
  if ((index < 0) ||
     (iVar4 = (list->super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>).count,
     iVar4 <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                                ,0x2ee,"(index >= 0 && index < list->count)",
                                "index >= 0 && index < list->count");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    iVar4 = (list->super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>).count;
  }
  plVar1 = (list->super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>).buffer;
  if (index + 1 < iVar4) {
    plVar6 = plVar1 + (index + 1);
    do {
      plVar1[index] = *plVar6;
      index = index + 1;
      plVar6 = plVar6 + 1;
    } while (iVar4 + -1 != index);
  }
  (list->super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>).count = iVar4 + -1;
  plVar1[iVar4 + -1] = 0;
  return;
}

Assistant:

void RemoveAt(TListType* list, int index)
        {
            Assert(index >= 0 && index < list->count);
            for (int j = index + 1; j < list->count; index++, j++)
            {
                list->buffer[index] = list->buffer[j];
            }
            list->count--;

            if (clearOldEntries)
            {
                ClearArray(list->buffer + list->count, 1);
            }
        }